

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

ostream * std::operator<<(ostream *ofs,vector<float,_std::allocator<float>_> *v)

{
  pointer pfVar1;
  size_t sVar2;
  ulong uVar3;
  char buf [128];
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  char local_b8 [136];
  
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"[",1);
  pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pfVar1) {
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(ofs,", ",2);
        pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      floaxie::ftoa<float,char>(pfVar1[uVar3],local_b8);
      local_d8 = local_c8;
      sVar2 = strlen(local_b8);
      __cxx11::string::_M_construct<char_const*>((string *)&local_d8,local_b8,local_b8 + sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(ofs,(char *)local_d8,local_d0);
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      uVar3 = uVar3 + 1;
      pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar1 >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"]",1);
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<float> &v) {
  // Use floaxie
  char buf[128];

  // TODO: multi-threading for further performance gain?

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
    floaxie::ftoa(v[i], buf);
    ofs << std::string(buf);
  }
  ofs << "]";

  return ofs;
}